

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t COVER_checkTotalCompressedSize
                 (ZDICT_cover_params_t parameters,size_t *samplesSizes,BYTE *samples,size_t *offsets
                 ,size_t nbTrainSamples,size_t nbSamples,BYTE *dict,size_t dictBufferCapacity)

{
  uint uVar1;
  void *dst_00;
  ZSTD_CCtx *cctx_00;
  ZSTD_CCtx *pZVar2;
  ZSTD_CDict *pZVar3;
  ulong in_RCX;
  long in_RDI;
  ulong in_R8;
  void *in_R9;
  double in_stack_00000018;
  size_t size;
  size_t maxSampleSize;
  size_t i;
  size_t dstCapacity;
  void *dst;
  ZSTD_CDict *cdict;
  ZSTD_CCtx *cctx;
  size_t totalCompressedSize;
  ulong local_90;
  ZSTD_CDict *local_88;
  ulong local_80;
  ZSTD_CDict *cdict_00;
  size_t in_stack_ffffffffffffff90;
  size_t dictSize;
  size_t sVar4;
  
  cdict_00 = (ZSTD_CDict *)&stack0x00000008;
  dictSize = 0xffffffffffffffff;
  local_88 = (ZSTD_CDict *)0x0;
  local_80 = in_RCX;
  if (1.0 <= in_stack_00000018) {
    local_80 = 0;
  }
  for (; local_80 < in_R8; local_80 = local_80 + 1) {
    if (local_88 < *(ZSTD_CDict **)(in_RDI + local_80 * 8)) {
      local_88 = *(ZSTD_CDict **)(in_RDI + local_80 * 8);
    }
  }
  dst_00 = (void *)ZSTD_compressBound((size_t)local_88);
  cctx_00 = (ZSTD_CCtx *)malloc((size_t)dst_00);
  pZVar2 = ZSTD_createCCtx();
  pZVar3 = ZSTD_createCDict(in_R9,dictSize,(int)((ulong)pZVar2 >> 0x20));
  if (((cctx_00 != (ZSTD_CCtx *)0x0) && (pZVar2 != (ZSTD_CCtx *)0x0)) &&
     (pZVar3 != (ZSTD_CDict *)0x0)) {
    local_90 = in_RCX;
    sVar4 = i;
    if (1.0 < *(double *)&cdict_00->dictContentType || *(double *)&cdict_00->dictContentType == 1.0)
    {
      local_90 = 0;
    }
    for (; dictSize = sVar4, local_90 < in_R8; local_90 = local_90 + 1) {
      in_stack_ffffffffffffff90 =
           ZSTD_compress_usingCDict
                     (cctx_00,dst_00,local_90,local_88,in_stack_ffffffffffffff90,cdict_00);
      uVar1 = ZSTD_isError(0x2921ec);
      dictSize = in_stack_ffffffffffffff90;
      if (uVar1 != 0) break;
      sVar4 = in_stack_ffffffffffffff90 + sVar4;
    }
  }
  ZSTD_freeCCtx((ZSTD_CCtx *)cdict_00);
  ZSTD_freeCDict(local_88);
  if (cctx_00 != (ZSTD_CCtx *)0x0) {
    free(cctx_00);
  }
  return dictSize;
}

Assistant:

size_t COVER_checkTotalCompressedSize(const ZDICT_cover_params_t parameters,
                                    const size_t *samplesSizes, const BYTE *samples,
                                    size_t *offsets,
                                    size_t nbTrainSamples, size_t nbSamples,
                                    BYTE *const dict, size_t dictBufferCapacity) {
  size_t totalCompressedSize = ERROR(GENERIC);
  /* Pointers */
  ZSTD_CCtx *cctx;
  ZSTD_CDict *cdict;
  void *dst;
  /* Local variables */
  size_t dstCapacity;
  size_t i;
  /* Allocate dst with enough space to compress the maximum sized sample */
  {
    size_t maxSampleSize = 0;
    i = parameters.splitPoint < 1.0 ? nbTrainSamples : 0;
    for (; i < nbSamples; ++i) {
      maxSampleSize = MAX(samplesSizes[i], maxSampleSize);
    }
    dstCapacity = ZSTD_compressBound(maxSampleSize);
    dst = malloc(dstCapacity);
  }
  /* Create the cctx and cdict */
  cctx = ZSTD_createCCtx();
  cdict = ZSTD_createCDict(dict, dictBufferCapacity,
                           parameters.zParams.compressionLevel);
  if (!dst || !cctx || !cdict) {
    goto _compressCleanup;
  }
  /* Compress each sample and sum their sizes (or error) */
  totalCompressedSize = dictBufferCapacity;
  i = parameters.splitPoint < 1.0 ? nbTrainSamples : 0;
  for (; i < nbSamples; ++i) {
    const size_t size = ZSTD_compress_usingCDict(
        cctx, dst, dstCapacity, samples + offsets[i],
        samplesSizes[i], cdict);
    if (ZSTD_isError(size)) {
      totalCompressedSize = size;
      goto _compressCleanup;
    }
    totalCompressedSize += size;
  }
_compressCleanup:
  ZSTD_freeCCtx(cctx);
  ZSTD_freeCDict(cdict);
  if (dst) {
    free(dst);
  }
  return totalCompressedSize;
}